

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.h
# Opt level: O0

_Bool bitset_container_get_range(bitset_container_t *bitset,uint32_t pos_start,uint32_t pos_end)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  uint32_t i;
  uint64_t last;
  uint64_t first;
  uint32_t end;
  uint32_t start;
  uint32_t pos_end_local;
  uint32_t pos_start_local;
  bitset_container_t *bitset_local;
  _Bool local_1;
  
  i = pos_start >> 6;
  uVar1 = pos_end >> 6;
  uVar2 = (1L << ((byte)pos_start & 0x3f)) - 1U ^ 0xffffffffffffffff;
  uVar3 = (1L << ((byte)pos_end & 0x3f)) - 1;
  if (i == uVar1) {
    local_1 = (bitset->words[uVar1] & uVar2 & uVar3) == (uVar2 & uVar3);
  }
  else if ((bitset->words[i] & uVar2) == uVar2) {
    if ((uVar1 < 0x400) && ((bitset->words[uVar1] & uVar3) != uVar3)) {
      local_1 = false;
    }
    else {
      do {
        i = i + 1;
        if (0x3ff < i || uVar1 <= i) {
          return true;
        }
      } while (bitset->words[i] == 0xffffffffffffffff);
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static inline bool bitset_container_get_range(const bitset_container_t *bitset,
                                              uint32_t pos_start,
                                              uint32_t pos_end) {
    const uint32_t start = pos_start >> 6;
    const uint32_t end = pos_end >> 6;

    const uint64_t first = ~((1ULL << (pos_start & 0x3F)) - 1);
    const uint64_t last = (1ULL << (pos_end & 0x3F)) - 1;

    if (start == end)
        return ((bitset->words[end] & first & last) == (first & last));
    if ((bitset->words[start] & first) != first) return false;

    if ((end < BITSET_CONTAINER_SIZE_IN_WORDS) &&
        ((bitset->words[end] & last) != last)) {
        return false;
    }

    for (uint32_t i = start + 1;
         (i < BITSET_CONTAINER_SIZE_IN_WORDS) && (i < end); ++i) {
        if (bitset->words[i] != UINT64_C(0xFFFFFFFFFFFFFFFF)) return false;
    }

    return true;
}